

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

bool __thiscall
DisasmReplayer::enqueue_create_graphics_pipeline
          (DisasmReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  VkResult VVar2;
  VkGraphicsPipelineCreateInfo *create_info_local;
  Hash hash_local;
  
  create_info_local = create_info;
  hash_local = hash;
  bVar1 = graphics_pipeline_is_active(this,hash);
  if (bVar1) {
    if (this->device == (VulkanDevice *)0x0) {
      *pipeline = (VkPipeline)hash;
    }
    else {
      if (this->device->pipeline_stats == true) {
        *(byte *)&create_info->flags = (byte)create_info->flags | 0xc0;
      }
      fprintf(_stderr,"Fossilize INFO: Creating graphics pipeline %0lX\n",hash);
      fflush(_stderr);
      VVar2 = (*vkCreateGraphicsPipelines)
                        (this->device->device,this->pipeline_cache,1,create_info,
                         (VkAllocationCallbacks *)0x0,pipeline);
      if (VVar2 != VK_SUCCESS) {
        fwrite("Fossilize ERROR:  ... Failed!\n",0x1e,1,_stderr);
        fflush(_stderr);
        return false;
      }
      fwrite("Fossilize INFO:  ... Succeeded!\n",0x20,1,_stderr);
      fflush(_stderr);
    }
    std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::push_back
              (&this->graphics_pipelines,pipeline);
    std::
    vector<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
    ::push_back(&this->graphics_infos,&create_info_local);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->graphics_hashes,&hash_local);
  }
  else {
    *pipeline = (VkPipeline)hash;
  }
  return true;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		if (!graphics_pipeline_is_active(hash))
		{
			*pipeline = fake_handle<VkPipeline>(hash);
			return true;
		}

		if (device)
		{
			if (device->has_pipeline_stats())
				const_cast<VkGraphicsPipelineCreateInfo *>(create_info)->flags |=
						VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR | VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR;

			LOGI("Creating graphics pipeline %0" PRIX64 "\n", hash);
			if (vkCreateGraphicsPipelines(device->get_device(), pipeline_cache, 1, create_info, nullptr, pipeline) !=
			    VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*pipeline = fake_handle<VkPipeline>(hash);

		graphics_pipelines.push_back(*pipeline);
		graphics_infos.push_back(create_info);
		graphics_hashes.push_back(hash);
		return true;
	}